

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_copy(mbedtls_mpi *X,mbedtls_mpi *Y)

{
  ulong uVar1;
  size_t sVar2;
  int iVar3;
  ulong nblimbs;
  size_t __n;
  
  if (X != Y) {
    uVar1 = Y->n;
    if (uVar1 == 0) {
      mbedtls_mpi_free(X);
    }
    else {
      sVar2 = uVar1 * 8;
      do {
        __n = sVar2;
        nblimbs = uVar1;
        if (nblimbs == 1) break;
        uVar1 = nblimbs - 1;
        sVar2 = __n - 8;
      } while (Y->p[nblimbs - 1] == 0);
      X->s = Y->s;
      if (X->n < nblimbs) {
        iVar3 = mbedtls_mpi_grow(X,nblimbs);
        if (iVar3 != 0) {
          return iVar3;
        }
      }
      else {
        memset(X->p + nblimbs,0,(X->n - nblimbs) * 8);
      }
      memcpy(X->p,Y->p,__n);
    }
  }
  return 0;
}

Assistant:

int mbedtls_mpi_copy( mbedtls_mpi *X, const mbedtls_mpi *Y )
{
    int ret = 0;
    size_t i;
    MPI_VALIDATE_RET( X != NULL );
    MPI_VALIDATE_RET( Y != NULL );

    if( X == Y )
        return( 0 );

    if( Y->n == 0 )
    {
        mbedtls_mpi_free( X );
        return( 0 );
    }

    for( i = Y->n - 1; i > 0; i-- )
        if( Y->p[i] != 0 )
            break;
    i++;

    X->s = Y->s;

    if( X->n < i )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, i ) );
    }
    else
    {
        memset( X->p + i, 0, ( X->n - i ) * ciL );
    }

    memcpy( X->p, Y->p, i * ciL );

cleanup:

    return( ret );
}